

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

DataDeclarationSyntax * __thiscall
slang::parsing::Parser::parseDataDeclaration(Parser *this,AttrList attributes)

{
  group_type_pointer pgVar1;
  undefined4 uVar2;
  uint uVar3;
  undefined2 prev;
  Token semi_00;
  ulong uVar4;
  bool bVar5;
  int iVar6;
  ulong pos0;
  Diagnostic *pDVar7;
  SyntaxNode *pSVar8;
  SourceLocation location;
  undefined4 extraout_var;
  DataDeclarationSyntax *pDVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  ulong hash;
  ulong uVar13;
  SyntaxNode *pSVar14;
  bitmask<slang::parsing::detail::TypeOptions> options;
  uint uVar15;
  uchar uVar16;
  uchar uVar18;
  uchar uVar19;
  uchar uVar20;
  undefined1 auVar17 [16];
  undefined1 auVar21 [16];
  Token TVar22;
  SourceRange SVar23;
  string_view sVar24;
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> sVar25;
  locator res;
  Token lastLifetime;
  Token semi;
  Token t;
  SmallMap<slang::parsing::TokenKind,_slang::parsing::Token,_4UL,_std::pair<const_slang::parsing::TokenKind,_slang::parsing::Token>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::parsing::TokenKind,_slang::parsing::Token>,_96UL,_16UL>_>
  modifierSet;
  SmallVector<slang::parsing::Token,_4UL> modifiers;
  undefined1 local_228 [32];
  size_t local_208;
  pointer local_200;
  __extent_storage<18446744073709551615UL> local_1f8;
  _func_int **local_1e8;
  Info *pIStack_1e0;
  pointer local_1d8;
  size_t local_1d0;
  ulong local_1c8;
  Parser *local_1c0;
  ulong local_1b8;
  Token local_1b0;
  undefined1 local_1a0 [16];
  undefined1 local_190 [16];
  pointer local_178;
  undefined1 local_168 [96];
  undefined1 *local_108;
  undefined1 *local_100;
  undefined1 local_f8 [24];
  value_type_pointer ppStack_e0;
  ulong local_d8;
  ulong local_d0;
  SmallVectorBase<slang::parsing::Token> local_c0 [2];
  undefined1 local_68 [32];
  EVP_PKEY_CTX *local_48;
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> local_40;
  
  local_1d0 = (size_t)attributes._M_extent._M_extent_value;
  local_1d8 = attributes._M_ptr;
  local_c0[0].data_ = (pointer)local_c0[0].firstElement;
  local_c0[0].len = 0;
  local_c0[0].cap = 4;
  local_108 = local_168;
  local_f8._0_8_ = 0x3f;
  local_f8._8_8_ = 1;
  stack0xffffffffffffff18 = ZEXT816(0x9543d0);
  local_d8 = 0;
  local_d0 = 0;
  local_100 = local_108;
  Token::Token((Token *)&local_1e8);
  bVar12 = false;
  bVar11 = false;
  bVar10 = false;
  options.m_bits = 0;
  local_1c0 = this;
LAB_00676ecd:
  do {
    do {
      TVar22 = ParserBase::peek(&this->super_ParserBase);
      bVar5 = slang::syntax::SyntaxFacts::isDeclarationModifier(TVar22.kind);
      if (!bVar5) {
        pSVar8 = (SyntaxNode *)parseDataType(this,options);
        if (pSVar8->kind == TypeReference && options.m_bits == 0) {
          local_228._0_16_ = (undefined1  [16])slang::syntax::SyntaxNode::getFirstToken(pSVar8);
          location = Token::location((Token *)local_228);
          ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0xaa0005,location);
        }
        Token::Token(&local_1b0);
        sVar25 = parseDeclarators<&slang::syntax::SyntaxFacts::isNotIdOrComma>
                           (this,Semicolon,&local_1b0,false,false);
        local_228._8_4_ = 1;
        local_228._16_16_ = (undefined1  [16])0x0;
        local_208 = local_1d0;
        local_200 = local_1d8;
        local_1f8._M_extent_value = local_1d0;
        local_228._0_8_ = &PTR_getChild_00cb67f8;
        iVar6 = SmallVectorBase<slang::parsing::Token>::copy
                          (local_c0,(EVP_PKEY_CTX *)(this->super_ParserBase).alloc,
                           (EVP_PKEY_CTX *)sVar25._M_extent._M_extent_value._M_extent_value);
        local_178 = (pointer)CONCAT44(extraout_var,iVar6);
        local_1a0._8_4_ = 2;
        local_190 = (undefined1  [16])0x0;
        local_1a0._0_8_ = &PTR_getChild_00cbee70;
        local_68._8_4_ = SeparatedList;
        local_68._16_16_ = (undefined1  [16])0x0;
        local_68._0_8_ = &PTR_getChild_00cbf2a8;
        semi_00.info = local_1b0.info;
        semi_00.kind = local_1b0.kind;
        semi_00._2_1_ = local_1b0._2_1_;
        semi_00.numFlags.raw = local_1b0.numFlags.raw;
        semi_00.rawLen = local_1b0.rawLen;
        local_48 = (EVP_PKEY_CTX *)sVar25._M_extent._M_extent_value._M_extent_value;
        local_40 = sVar25;
        pDVar9 = slang::syntax::SyntaxFactory::dataDeclaration
                           (&this->factory,
                            (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)local_228,
                            (TokenList *)local_1a0,(DataTypeSyntax *)pSVar8,
                            (SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *)local_68,semi_00
                           );
        local_228._0_8_ = local_100;
        if (ppStack_e0 != (pair<const_slang::parsing::TokenKind,_slang::parsing::Token> *)0x0) {
          detail::hashing::
          StackAllocator<std::pair<const_slang::parsing::TokenKind,_slang::parsing::Token>,_96UL,_16UL>
          ::deallocate((StackAllocator<std::pair<const_slang::parsing::TokenKind,_slang::parsing::Token>,_96UL,_16UL>
                        *)local_228,ppStack_e0,(local_f8._8_8_ * 0x178 + 0x186U) / 0x18);
        }
        if (local_c0[0].data_ != (pointer)local_c0[0].firstElement) {
          operator_delete(local_c0[0].data_);
        }
        return pDVar9;
      }
      local_1a0 = (undefined1  [16])ParserBase::consume(&this->super_ParserBase);
      SmallVectorBase<slang::parsing::Token>::emplace_back<slang::parsing::Token_const&>
                (local_c0,(Token *)local_1a0);
      this = local_1c0;
      auVar17[0] = -(local_1a0[0] == 'C');
      auVar17[1] = -(local_1a0[1] == '\x01');
      auVar17[2] = 0xff;
      auVar17[3] = 0xff;
      auVar17[4] = 0xff;
      auVar17[5] = 0xff;
      auVar17[6] = 0xff;
      auVar17[7] = 0xff;
      auVar17[8] = 0xff;
      auVar17[9] = 0xff;
      auVar17[10] = 0xff;
      auVar17[0xb] = 0xff;
      auVar17[0xc] = 0xff;
      auVar17[0xd] = 0xff;
      auVar17[0xe] = 0xff;
      auVar17[0xf] = 0xff;
      if ((ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe | 0x8000) == 0xffff) {
        options.m_bits = 1;
      }
      hash = SUB168(ZEXT216((ushort)local_1a0._0_2_) * ZEXT816(0x9e3779b97f4a7c15),8) ^
             SUB168(ZEXT216((ushort)local_1a0._0_2_) * ZEXT816(0x9e3779b97f4a7c15),0);
      pos0 = hash >> (local_f8[0] & 0x3f);
      uVar2 = (&boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)::
                word)[hash & 0xff];
      local_1c8 = local_f8._8_8_;
      uVar13 = pos0;
      uVar4 = 0;
      do {
        local_1b8 = uVar4;
        pgVar1 = (group_type_pointer)(local_f8._16_8_ + uVar13 * 0x10);
        uVar16 = (uchar)uVar2;
        auVar21[0] = -(pgVar1->m[0].n == uVar16);
        uVar18 = (uchar)((uint)uVar2 >> 8);
        auVar21[1] = -(pgVar1->m[1].n == uVar18);
        uVar19 = (uchar)((uint)uVar2 >> 0x10);
        auVar21[2] = -(pgVar1->m[2].n == uVar19);
        uVar20 = (uchar)((uint)uVar2 >> 0x18);
        auVar21[3] = -(pgVar1->m[3].n == uVar20);
        auVar21[4] = -(pgVar1->m[4].n == uVar16);
        auVar21[5] = -(pgVar1->m[5].n == uVar18);
        auVar21[6] = -(pgVar1->m[6].n == uVar19);
        auVar21[7] = -(pgVar1->m[7].n == uVar20);
        auVar21[8] = -(pgVar1->m[8].n == uVar16);
        auVar21[9] = -(pgVar1->m[9].n == uVar18);
        auVar21[10] = -(pgVar1->m[10].n == uVar19);
        auVar21[0xb] = -(pgVar1->m[0xb].n == uVar20);
        auVar21[0xc] = -(pgVar1->m[0xc].n == uVar16);
        auVar21[0xd] = -(pgVar1->m[0xd].n == uVar18);
        auVar21[0xe] = -(pgVar1->m[0xe].n == uVar19);
        auVar21[0xf] = -(pgVar1->m[0xf].n == uVar20);
        for (uVar15 = (uint)(ushort)((ushort)(SUB161(auVar21 >> 7,0) & 1) |
                                     (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1 |
                                     (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
                                     (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
                                     (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
                                     (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
                                     (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
                                     (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
                                     (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
                                     (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
                                     (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
                                     (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
                                     (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
                                     (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
                                    (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe); uVar15 != 0;
            uVar15 = uVar15 - 1 & uVar15) {
          uVar3 = 0;
          if (uVar15 != 0) {
            for (; (uVar15 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
            }
          }
          if (local_1a0._0_2_ == ppStack_e0[uVar13 * 0xf + (ulong)uVar3].first) {
            pSVar8 = (SyntaxNode *)(ppStack_e0 + uVar13 * 0xf + (ulong)uVar3);
            goto LAB_00677059;
          }
        }
        if ((((group_type_pointer)(local_f8._16_8_ + uVar13 * 0x10))->m[0xf].n &
            (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7]) == 0) break;
        uVar13 = uVar13 + local_1b8 + 1 & local_f8._8_8_;
        uVar4 = local_1b8 + 1;
      } while (local_1b8 + 1 <= (ulong)local_f8._8_8_);
      pSVar8 = (SyntaxNode *)0x0;
LAB_00677059:
      pSVar14 = pSVar8;
      if (pSVar8 == (SyntaxNode *)0x0) {
        if (local_d0 < local_d8) {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,slang::parsing::Token>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,slang::detail::hashing::StackAllocator<std::pair<slang::parsing::TokenKind_const,slang::parsing::Token>,96ul,16ul>>
          ::
          nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind&,slang::parsing::Token&>
                    ((locator *)local_228,
                     (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,slang::parsing::Token>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,slang::detail::hashing::StackAllocator<std::pair<slang::parsing::TokenKind_const,slang::parsing::Token>,96ul,16ul>>
                      *)&local_100,(arrays_type *)local_f8,pos0,hash,(try_emplace_args_t *)local_68,
                     (TokenKind *)local_1a0,(Token *)local_1a0);
          local_d0 = local_d0 + 1;
        }
        else {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,slang::parsing::Token>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,slang::detail::hashing::StackAllocator<std::pair<slang::parsing::TokenKind_const,slang::parsing::Token>,96ul,16ul>>
          ::
          unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind&,slang::parsing::Token&>
                    ((locator *)local_228,
                     (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,slang::parsing::Token>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,slang::detail::hashing::StackAllocator<std::pair<slang::parsing::TokenKind_const,slang::parsing::Token>,96ul,16ul>>
                      *)&local_100,hash,(try_emplace_args_t *)local_68,(TokenKind *)local_1a0,
                     (Token *)local_1a0);
        }
        pSVar14 = (SyntaxNode *)local_228._16_8_;
      }
      if ((pSVar8 != (SyntaxNode *)0x0) && (!bVar10)) {
        SVar23 = Token::range((Token *)local_1a0);
        pDVar7 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x260005,SVar23);
        sVar24 = Token::rawText((Token *)local_1a0);
        pDVar7 = Diagnostic::operator<<(pDVar7,sVar24);
        SVar23 = Token::range((Token *)&pSVar14->parent);
        bVar10 = true;
        Diagnostic::operator<<(pDVar7,SVar23);
      }
    } while (pSVar8 != (SyntaxNode *)0x0);
    bVar5 = slang::syntax::SyntaxFacts::isLifetimeModifier(local_1a0._0_2_);
    if (!bVar5) {
LAB_006771c2:
      if ((!bVar12) && (1 < local_c0[0].len)) {
        prev = local_c0[0].data_[local_c0[0].len - 2].kind;
        local_228._0_16_ = *(undefined1 (*) [16])(local_c0[0].data_ + (local_c0[0].len - 2));
        bVar5 = slang::syntax::SyntaxFacts::isModifierAllowedAfter(local_1a0._0_2_,prev);
        if (!bVar5) {
          SVar23 = Token::range((Token *)local_1a0);
          pDVar7 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x180005,SVar23);
          sVar24 = Token::rawText((Token *)local_1a0);
          Diagnostic::operator<<(pDVar7,sVar24);
          sVar24 = Token::rawText((Token *)local_228);
          pDVar7 = Diagnostic::operator<<(pDVar7,sVar24);
          SVar23 = Token::range((Token *)local_228);
          bVar12 = true;
          Diagnostic::operator<<(pDVar7,SVar23);
        }
      }
      goto LAB_00676ecd;
    }
    if (pIStack_1e0 == (Info *)0x0) {
      local_1e8 = (_func_int **)local_1a0._0_8_;
      pIStack_1e0 = (Info *)local_1a0._8_8_;
      goto LAB_006771c2;
    }
    if (!bVar11) {
      SVar23 = Token::range((Token *)local_1a0);
      pDVar7 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x170005,SVar23);
      sVar24 = Token::rawText((Token *)local_1a0);
      Diagnostic::operator<<(pDVar7,sVar24);
      sVar24 = Token::rawText((Token *)&local_1e8);
      pDVar7 = Diagnostic::operator<<(pDVar7,sVar24);
      SVar23 = Token::range((Token *)&local_1e8);
      bVar11 = true;
      Diagnostic::operator<<(pDVar7,SVar23);
    }
  } while( true );
}

Assistant:

DataDeclarationSyntax& Parser::parseDataDeclaration(AttrList attributes) {
    SmallVector<Token, 4> modifiers;
    SmallMap<TokenKind, Token, 4> modifierSet;
    Token lastLifetime;
    bool hasVar = false;
    bool errorDup = false;
    bool errorLifetime = false;
    bool errorOrdering = false;

    while (isDeclarationModifier(peek().kind)) {
        Token t = consume();
        modifiers.push_back(t);
        if (t.kind == TokenKind::VarKeyword)
            hasVar = true;

        if (auto [it, inserted] = modifierSet.emplace(t.kind, t); !inserted) {
            if (!errorDup) {
                auto& diag = addDiag(diag::DuplicateDeclModifier, t.range());
                diag << t.rawText() << it->second.range();
                errorDup = true;
            }
            continue;
        }

        if (SyntaxFacts::isLifetimeModifier(t.kind)) {
            if (lastLifetime) {
                if (!errorLifetime) {
                    auto& diag = addDiag(diag::DeclModifierConflict, t.range());
                    diag << t.rawText();
                    diag << lastLifetime.rawText() << lastLifetime.range();
                    errorLifetime = true;
                }
                continue;
            }
            lastLifetime = t;
        }

        if (!errorOrdering && modifiers.size() > 1) {
            Token prev = modifiers[modifiers.size() - 2];
            if (!SyntaxFacts::isModifierAllowedAfter(t.kind, prev.kind)) {
                auto& diag = addDiag(diag::DeclModifierOrdering, t.range());
                diag << t.rawText();
                diag << prev.rawText() << prev.range();
                errorOrdering = true;
            }
        }
    }

    auto& dataType = parseDataType(hasVar ? TypeOptions::AllowImplicit : TypeOptions::None);
    if (dataType.kind == SyntaxKind::TypeReference && !hasVar)
        addDiag(diag::TypeRefDeclVar, dataType.getFirstToken().location());

    Token semi;
    auto declarators = parseDeclarators(semi);

    return factory.dataDeclaration(attributes, modifiers.copy(alloc), dataType, declarators, semi);
}